

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Federate.cpp
# Opt level: O2

Filter * __thiscall helics::Federate::getFilter(Federate *this,string_view filterName)

{
  ConnectorFederateManager *this_00;
  Filter *pFVar1;
  string_view name;
  string local_48;
  
  pFVar1 = ConnectorFederateManager::getFilter
                     ((this->cManager)._M_t.
                      super___uniq_ptr_impl<helics::ConnectorFederateManager,_std::default_delete<helics::ConnectorFederateManager>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_helics::ConnectorFederateManager_*,_std::default_delete<helics::ConnectorFederateManager>_>
                      .super__Head_base<0UL,_helics::ConnectorFederateManager_*,_false>._M_head_impl
                      ,filterName);
  if ((pFVar1->super_Interface).handle.hid == -1700000000) {
    this_00 = (this->cManager)._M_t.
              super___uniq_ptr_impl<helics::ConnectorFederateManager,_std::default_delete<helics::ConnectorFederateManager>_>
              ._M_t.
              super__Tuple_impl<0UL,_helics::ConnectorFederateManager_*,_std::default_delete<helics::ConnectorFederateManager>_>
              .super__Head_base<0UL,_helics::ConnectorFederateManager_*,_false>._M_head_impl;
    localNameGenerator_abi_cxx11_(&local_48,this,filterName);
    name._M_str = local_48._M_dataplus._M_p;
    name._M_len = local_48._M_string_length;
    pFVar1 = ConnectorFederateManager::getFilter(this_00,name);
    std::__cxx11::string::~string((string *)&local_48);
  }
  return pFVar1;
}

Assistant:

const Filter& Federate::getFilter(std::string_view filterName) const
{
    const Filter& filt = cManager->getFilter(filterName);
    if (!filt.isValid()) {
        return cManager->getFilter(localNameGenerator(filterName));
    }
    return filt;
}